

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.cpp
# Opt level: O0

bool MeCab::Dictionary::assignUserDictionaryCosts
               (Param *param,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *dics,char *output)

{
  bool bVar1;
  undefined1 uVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  char *pcVar7;
  ostream *poVar8;
  size_t sVar9;
  size_t sVar10;
  size_type sVar11;
  const_reference pvVar12;
  DictionaryRewriter *this;
  string *ufeature_00;
  string *lfeature_00;
  string *rfeature_00;
  int __oflag;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  char *in_RDX;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RSI;
  char *in_RDI;
  int rid;
  int lid;
  string rfeature;
  string lfeature;
  string ufeature;
  int cost;
  string feature;
  string w;
  size_t n;
  char *col [8];
  size_t tmplen;
  char *tmpstr;
  scoped_fixed_array<char,_8192> line;
  ifstream ifs;
  size_t i;
  ofstream ofs;
  Iconv config_iconv;
  string config_charset;
  int factor;
  string from;
  string rewrite_file;
  string right_id_file;
  string left_id_file;
  string matrix_bin_file;
  string matrix_file;
  string dicdir;
  CharProperty property;
  ContextID cid;
  DecoderFeatureIndex fi;
  DictionaryRewriter rewriter;
  Connector matrix;
  char *in_stack_ffffffffffffebb8;
  DecoderFeatureIndex *in_stack_ffffffffffffebc0;
  DecoderFeatureIndex *in_stack_ffffffffffffebd0;
  CharProperty *in_stack_ffffffffffffebe0;
  string *in_stack_ffffffffffffebe8;
  ostream *in_stack_ffffffffffffebf0;
  ostream *in_stack_ffffffffffffebf8;
  ostream *in_stack_ffffffffffffec00;
  ostream *in_stack_ffffffffffffec10;
  ostream *in_stack_ffffffffffffec68;
  ContextID *in_stack_ffffffffffffec70;
  Param *in_stack_ffffffffffffec78;
  char *in_stack_ffffffffffffec80;
  Param *in_stack_ffffffffffffec88;
  undefined7 in_stack_ffffffffffffed48;
  CharProperty *in_stack_ffffffffffffee68;
  DictionaryRewriter *in_stack_ffffffffffffee70;
  DecoderFeatureIndex *in_stack_ffffffffffffee78;
  ostream *in_stack_ffffffffffffee80;
  Connector *in_stack_ffffffffffffee88;
  ostream *in_stack_ffffffffffffee90;
  die local_f95;
  int local_f94;
  int local_f90;
  byte local_f8a;
  die local_f89;
  string local_f88 [32];
  string local_f68 [32];
  string local_f48 [32];
  int local_f28;
  allocator local_f21;
  string local_f20 [39];
  allocator local_ef9;
  string local_ef8 [38];
  byte local_ed2;
  die local_ed1;
  string *local_ed0;
  char *local_ec8;
  char *local_ea8;
  size_t local_e88;
  string *local_e80;
  scoped_fixed_array<char,_8192> local_e78;
  byte local_e5a;
  die local_e59;
  long local_e58 [65];
  ulong local_c50;
  byte local_c42;
  die local_c41;
  long local_c40 [64];
  byte local_a40;
  die local_a3f;
  byte local_a3e;
  die local_a3d;
  byte local_a3c;
  die local_a3b;
  byte local_a3a;
  die local_a39;
  Iconv local_a38;
  byte local_a22;
  die local_a21;
  string local_a20 [34];
  byte local_9fe;
  die local_9fd;
  int local_9fc;
  string local_9f8 [39];
  allocator local_9d1;
  string local_9d0 [32];
  string local_9b0 [39];
  allocator local_989;
  string local_988 [32];
  string local_968 [39];
  allocator local_941;
  string local_940 [32];
  string local_920 [39];
  allocator local_8f9;
  string local_8f8 [32];
  string local_8d8 [39];
  allocator local_8b1;
  string local_8b0 [32];
  string local_890 [32];
  string local_870 [32];
  CharProperty local_850;
  ContextID local_678;
  DecoderFeatureIndex local_5c8;
  DictionaryRewriter local_250;
  Connector local_1d8;
  char *local_18;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_10;
  char *local_8;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  Connector::Connector((Connector *)in_stack_ffffffffffffebe0);
  DictionaryRewriter::DictionaryRewriter((DictionaryRewriter *)in_stack_ffffffffffffebc0);
  DecoderFeatureIndex::DecoderFeatureIndex(in_stack_ffffffffffffebd0);
  ContextID::ContextID((ContextID *)in_stack_ffffffffffffebc0);
  CharProperty::CharProperty(in_stack_ffffffffffffebe0);
  Param::get<std::__cxx11::string>(in_stack_ffffffffffffec88,in_stack_ffffffffffffec80);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_8b0,"matrix.def",&local_8b1);
  create_filename(in_stack_ffffffffffffebe8,(string *)in_stack_ffffffffffffebe0);
  std::__cxx11::string::~string(local_8b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_8b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_8f8,"matrix.bin",&local_8f9);
  create_filename(in_stack_ffffffffffffebe8,(string *)in_stack_ffffffffffffebe0);
  std::__cxx11::string::~string(local_8f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_8f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_940,"left-id.def",&local_941);
  create_filename(in_stack_ffffffffffffebe8,(string *)in_stack_ffffffffffffebe0);
  std::__cxx11::string::~string(local_940);
  std::allocator<char>::~allocator((allocator<char> *)&local_941);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_988,"right-id.def",&local_989);
  create_filename(in_stack_ffffffffffffebe8,(string *)in_stack_ffffffffffffebe0);
  std::__cxx11::string::~string(local_988);
  std::allocator<char>::~allocator((allocator<char> *)&local_989);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_9d0,"rewrite.def",&local_9d1);
  create_filename(in_stack_ffffffffffffebe8,(string *)in_stack_ffffffffffffebe0);
  std::__cxx11::string::~string(local_9d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_9d1);
  Param::get<std::__cxx11::string>(in_stack_ffffffffffffec88,in_stack_ffffffffffffec80);
  local_9fc = Param::get<int>(in_stack_ffffffffffffec78,(char *)in_stack_ffffffffffffec70);
  local_9fe = 0;
  if (local_9fc < 1) {
    die::die(&local_9fd);
    local_9fe = 1;
    poVar8 = std::operator<<((ostream *)&std::cerr,
                             "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/dictionary.cpp"
                            );
    poVar8 = std::operator<<(poVar8,"(");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x9b);
    poVar8 = std::operator<<(poVar8,") [");
    poVar8 = std::operator<<(poVar8,"factor > 0");
    poVar8 = std::operator<<(poVar8,"] ");
    poVar8 = std::operator<<(poVar8,"cost factor needs to be positive value");
    die::operator&(&local_9fd,poVar8);
  }
  if ((local_9fe & 1) != 0) {
    die::~die((die *)0x131e08);
  }
  Param::get<std::__cxx11::string>(in_stack_ffffffffffffec88,in_stack_ffffffffffffec80);
  uVar6 = std::__cxx11::string::empty();
  if ((uVar6 & 1) != 0) {
    std::__cxx11::string::operator=(local_a20,local_9f8);
  }
  uVar6 = std::__cxx11::string::empty();
  local_a22 = 0;
  if ((uVar6 & 1) != 0) {
    die::die(&local_a21);
    local_a22 = 1;
    poVar8 = std::operator<<((ostream *)&std::cerr,
                             "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/dictionary.cpp"
                            );
    poVar8 = std::operator<<(poVar8,"(");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0xa2);
    poVar8 = std::operator<<(poVar8,") [");
    poVar8 = std::operator<<(poVar8,"!from.empty()");
    poVar8 = std::operator<<(poVar8,"] ");
    poVar8 = std::operator<<(poVar8,"input dictionary charset is empty");
    die::operator&(&local_a21,poVar8);
  }
  if ((local_a22 & 1) != 0) {
    die::~die((die *)0x1321c3);
  }
  Iconv::Iconv(&local_a38);
  pcVar7 = (char *)std::__cxx11::string::c_str();
  iVar4 = std::__cxx11::string::c_str();
  local_a3a = 0;
  uVar5 = Iconv::open(&local_a38,pcVar7,iVar4);
  if ((uVar5 & 1) == 0) {
    die::die(&local_a39);
    local_a3a = 1;
    poVar8 = std::operator<<((ostream *)&std::cerr,
                             "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/dictionary.cpp"
                            );
    poVar8 = std::operator<<(poVar8,"(");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0xa5);
    poVar8 = std::operator<<(poVar8,") [");
    poVar8 = std::operator<<(poVar8,"config_iconv.open(config_charset.c_str(), from.c_str())");
    poVar8 = std::operator<<(poVar8,"] ");
    poVar8 = std::operator<<(poVar8,"iconv_open() failed with from=");
    poVar8 = std::operator<<(poVar8,local_a20);
    poVar8 = std::operator<<(poVar8," to=");
    poVar8 = std::operator<<(poVar8,local_9f8);
    die::operator&(&local_a39,poVar8);
  }
  if ((local_a3a & 1) != 0) {
    die::~die((die *)0x1323a3);
  }
  pcVar7 = (char *)std::__cxx11::string::c_str();
  DictionaryRewriter::open(&local_250,pcVar7,(int)&local_a38);
  local_a3c = 0;
  uVar5 = DecoderFeatureIndex::open(&local_5c8,local_8,__oflag);
  iVar4 = extraout_EDX;
  if ((uVar5 & 1) == 0) {
    die::die(&local_a3b);
    local_a3c = 1;
    poVar8 = std::operator<<((ostream *)&std::cerr,
                             "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/dictionary.cpp"
                            );
    poVar8 = std::operator<<(poVar8,"(");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0xa9);
    poVar8 = std::operator<<(poVar8,") [");
    poVar8 = std::operator<<(poVar8,"fi.open(param)");
    poVar8 = std::operator<<(poVar8,"] ");
    poVar8 = std::operator<<(poVar8,"cannot open feature index");
    die::operator&(&local_a3b,poVar8);
    iVar4 = extraout_EDX_00;
  }
  if ((local_a3c & 1) != 0) {
    die::~die((die *)0x13251a);
    iVar4 = extraout_EDX_01;
  }
  local_a3e = 0;
  uVar5 = CharProperty::open(&local_850,local_8,iVar4);
  if ((uVar5 & 1) == 0) {
    die::die(&local_a3d);
    local_a3e = 1;
    poVar8 = std::operator<<((ostream *)&std::cerr,
                             "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/dictionary.cpp"
                            );
    poVar8 = std::operator<<(poVar8,"(");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0xab);
    poVar8 = std::operator<<(poVar8,") [");
    poVar8 = std::operator<<(poVar8,"property.open(param)");
    poVar8 = std::operator<<(poVar8,"] ");
    die::operator&(&local_a3d,poVar8);
  }
  if ((local_a3e & 1) != 0) {
    die::~die((die *)0x13264c);
  }
  std::__cxx11::string::c_str();
  CharProperty::set_charset((CharProperty *)in_stack_ffffffffffffebc0,in_stack_ffffffffffffebb8);
  std::__cxx11::string::c_str();
  bVar1 = Connector::openText(in_stack_ffffffffffffee88,(char *)in_stack_ffffffffffffee80);
  if (!bVar1) {
    pcVar7 = (char *)std::__cxx11::string::c_str();
    uVar5 = Connector::open(&local_1d8,pcVar7,0x169cac);
    if ((uVar5 & 1) == 0) {
      Connector::set_left_size(&local_1d8,1);
      Connector::set_right_size(&local_1d8,1);
    }
  }
  pcVar7 = (char *)std::__cxx11::string::c_str();
  iVar4 = std::__cxx11::string::c_str();
  ContextID::open(&local_678,pcVar7,iVar4,&local_a38);
  local_a40 = 0;
  sVar9 = ContextID::left_size((ContextID *)0x132847);
  sVar10 = Connector::left_size(&local_1d8);
  if (sVar9 == sVar10) {
    sVar9 = ContextID::right_size((ContextID *)0x13288a);
    sVar10 = Connector::right_size(&local_1d8);
    if (sVar9 == sVar10) goto LAB_00132b70;
  }
  die::die(&local_a3f);
  local_a40 = 1;
  poVar8 = std::operator<<((ostream *)&std::cerr,
                           "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/dictionary.cpp"
                          );
  poVar8 = std::operator<<(poVar8,"(");
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,0xb7);
  poVar8 = std::operator<<(poVar8,") [");
  poVar8 = std::operator<<(poVar8,
                           "cid.left_size() == matrix.left_size() && cid.right_size() == matrix.right_size()"
                          );
  in_stack_ffffffffffffee90 = std::operator<<(poVar8,"] ");
  in_stack_ffffffffffffee88 =
       (Connector *)std::operator<<(in_stack_ffffffffffffee90,"Context ID files(");
  in_stack_ffffffffffffee80 = std::operator<<((ostream *)in_stack_ffffffffffffee88,local_920);
  in_stack_ffffffffffffee78 =
       (DecoderFeatureIndex *)std::operator<<(in_stack_ffffffffffffee80," or ");
  in_stack_ffffffffffffee70 =
       (DictionaryRewriter *)std::operator<<((ostream *)in_stack_ffffffffffffee78,local_968);
  in_stack_ffffffffffffee68 =
       (CharProperty *)std::operator<<((ostream *)in_stack_ffffffffffffee70," may be broken: ");
  sVar9 = ContextID::left_size((ContextID *)0x132a32);
  poVar8 = (ostream *)std::ostream::operator<<(in_stack_ffffffffffffee68,sVar9);
  poVar8 = std::operator<<(poVar8," ");
  sVar9 = Connector::left_size(&local_1d8);
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,sVar9);
  poVar8 = std::operator<<(poVar8," ");
  sVar9 = ContextID::right_size((ContextID *)0x132ada);
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,sVar9);
  poVar8 = std::operator<<(poVar8," ");
  sVar9 = Connector::right_size(&local_1d8);
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,sVar9);
  die::operator&(&local_a3f,poVar8);
LAB_00132b70:
  if ((local_a40 & 1) != 0) {
    die::~die((die *)0x132b89);
  }
  std::ofstream::ofstream(local_c40,local_18,_S_out);
  local_c42 = 0;
  bVar1 = std::ios::operator_cast_to_bool
                    ((ios *)((long)local_c40 + *(long *)(local_c40[0] + -0x18)));
  if (!bVar1) {
    die::die(&local_c41);
    local_c42 = 1;
    poVar8 = std::operator<<((ostream *)&std::cerr,
                             "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/dictionary.cpp"
                            );
    poVar8 = std::operator<<(poVar8,"(");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0xc0);
    poVar8 = std::operator<<(poVar8,") [");
    poVar8 = std::operator<<(poVar8,"ofs");
    poVar8 = std::operator<<(poVar8,"] ");
    poVar8 = std::operator<<(poVar8,"permission denied: ");
    poVar8 = std::operator<<(poVar8,local_18);
    die::operator&(&local_c41,poVar8);
  }
  if ((local_c42 & 1) != 0) {
    die::~die((die *)0x132d18);
  }
  for (local_c50 = 0; uVar6 = local_c50,
      sVar11 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::size(local_10), uVar6 < sVar11; local_c50 = local_c50 + 1) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[](local_10,local_c50);
    pcVar7 = (char *)std::__cxx11::string::c_str();
    std::ifstream::ifstream(local_e58,pcVar7,_S_in);
    local_e5a = 0;
    bVar1 = std::ios::operator_cast_to_bool
                      ((ios *)((long)local_e58 + *(long *)(local_e58[0] + -0x18)));
    if (!bVar1) {
      die::die(&local_e59);
      local_e5a = 1;
      poVar8 = std::operator<<((ostream *)&std::cerr,
                               "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/dictionary.cpp"
                              );
      poVar8 = std::operator<<(poVar8,"(");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,0xc4);
      poVar8 = std::operator<<(poVar8,") [");
      poVar8 = std::operator<<(poVar8,"ifs");
      poVar8 = std::operator<<(poVar8,"] ");
      poVar8 = std::operator<<(poVar8,"no such file or directory: ");
      pvVar12 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator[](local_10,local_c50);
      poVar8 = std::operator<<(poVar8,(string *)pvVar12);
      die::operator&(&local_e59,poVar8);
    }
    if ((local_e5a & 1) != 0) {
      die::~die((die *)0x132f0c);
    }
    poVar8 = std::operator<<((ostream *)&std::cout,"reading ");
    pvVar12 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator[](local_10,local_c50);
    poVar8 = std::operator<<(poVar8,(string *)pvVar12);
    std::operator<<(poVar8," ... ");
    scoped_fixed_array<char,_8192>::scoped_fixed_array
              ((scoped_fixed_array<char,_8192> *)in_stack_ffffffffffffebc0);
    while( true ) {
      pcVar7 = scoped_fixed_array<char,_8192>::get(&local_e78);
      scoped_fixed_array<char,_8192>::size(&local_e78);
      this = (DictionaryRewriter *)std::istream::getline((char *)local_e58,(long)pcVar7);
      uVar2 = std::ios::operator_cast_to_bool
                        ((ios *)((long)&(this->unigram_rewrite_).
                                        super_vector<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>
                                        .
                                        super__Vector_base<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>
                                        ._M_impl.super__Vector_impl_data._M_start +
                                *(long *)&((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            *)((long)((this->unigram_rewrite_).
                                                                                                            
                                                  super_vector<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>
                                                  .
                                                  super__Vector_base<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>
                                                  ._M_impl.super__Vector_impl_data._M_start +
                                                  0xffffffffffffffff) + 0x18))->
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ));
      if (!(bool)uVar2) break;
      ufeature_00 = (string *)scoped_fixed_array<char,_8192>::get(&local_e78);
      local_e80 = ufeature_00;
      if (((ufeature_00 != (string *)0x0) &&
          (local_e88 = strlen((char *)ufeature_00), local_e88 != 0)) &&
         (local_e80[local_e88 - 1] == (string)0xd)) {
        local_e80[local_e88 - 1] = (string)0x0;
      }
      lfeature_00 = (string *)scoped_fixed_array<char,_8192>::get(&local_e78);
      rfeature_00 = (string *)
                    tokenizeCSV<char**>((char *)in_stack_ffffffffffffec00,
                                        (char **)in_stack_ffffffffffffebf8,
                                        (size_t)in_stack_ffffffffffffebf0);
      local_ed2 = 0;
      local_ed0 = rfeature_00;
      if (rfeature_00 != (string *)0x5) {
        die::die(&local_ed1);
        local_ed2 = 1;
        poVar8 = std::operator<<((ostream *)&std::cerr,
                                 "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/dictionary.cpp"
                                );
        poVar8 = std::operator<<(poVar8,"(");
        poVar8 = (ostream *)std::ostream::operator<<(poVar8,0xd8);
        poVar8 = std::operator<<(poVar8,") [");
        poVar8 = std::operator<<(poVar8,"n == 5");
        poVar8 = std::operator<<(poVar8,"] ");
        poVar8 = std::operator<<(poVar8,"format error: ");
        pcVar7 = scoped_fixed_array<char,_8192>::get(&local_e78);
        poVar8 = std::operator<<(poVar8,pcVar7);
        die::operator&(&local_ed1,poVar8);
      }
      if ((local_ed2 & 1) != 0) {
        die::~die((die *)0x133335);
      }
      pcVar7 = local_ec8;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_ef8,pcVar7,&local_ef9);
      std::allocator<char>::~allocator((allocator<char> *)&local_ef9);
      pcVar7 = local_ea8;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_f20,pcVar7,&local_f21);
      std::allocator<char>::~allocator((allocator<char> *)&local_f21);
      local_f28 = anon_unknown_0::calcCost
                            ((string *)in_stack_ffffffffffffee90,(string *)in_stack_ffffffffffffee88
                             ,(int)((ulong)in_stack_ffffffffffffee80 >> 0x20),
                             in_stack_ffffffffffffee78,in_stack_ffffffffffffee70,
                             in_stack_ffffffffffffee68);
      std::__cxx11::string::string(local_f48);
      std::__cxx11::string::string(local_f68);
      std::__cxx11::string::string(local_f88);
      local_f8a = 0;
      bVar1 = DictionaryRewriter::rewrite
                        (this,(string *)CONCAT17(uVar2,in_stack_ffffffffffffed48),ufeature_00,
                         lfeature_00,rfeature_00);
      if (!bVar1) {
        die::die(&local_f89);
        local_f8a = 1;
        poVar8 = std::operator<<((ostream *)&std::cerr,
                                 "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/dictionary.cpp"
                                );
        poVar8 = std::operator<<(poVar8,"(");
        poVar8 = (ostream *)std::ostream::operator<<(poVar8,0xde);
        poVar8 = std::operator<<(poVar8,") [");
        poVar8 = std::operator<<(poVar8,"rewriter.rewrite(feature, &ufeature, &lfeature, &rfeature)"
                                );
        poVar8 = std::operator<<(poVar8,"] ");
        in_stack_ffffffffffffec70 = (ContextID *)std::operator<<(poVar8,"rewrite failed: ");
        in_stack_ffffffffffffec68 = std::operator<<((ostream *)in_stack_ffffffffffffec70,local_f20);
        die::operator&(&local_f89,in_stack_ffffffffffffec68);
      }
      if ((local_f8a & 1) != 0) {
        die::~die((die *)0x1335e8);
      }
      std::__cxx11::string::c_str();
      local_f90 = ContextID::lid(in_stack_ffffffffffffec70,(char *)in_stack_ffffffffffffec68);
      std::__cxx11::string::c_str();
      local_f94 = ContextID::rid(in_stack_ffffffffffffec70,(char *)in_stack_ffffffffffffec68);
      bVar1 = false;
      if (((local_f90 < 0) || (local_f94 < 0)) ||
         (bVar3 = Connector::is_valid(&local_1d8,(long)local_f90,(long)local_f94), !bVar3)) {
        die::die(&local_f95);
        bVar1 = true;
        poVar8 = std::operator<<((ostream *)&std::cerr,
                                 "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/dictionary.cpp"
                                );
        poVar8 = std::operator<<(poVar8,"(");
        poVar8 = (ostream *)std::ostream::operator<<(poVar8,0xe2);
        poVar8 = std::operator<<(poVar8,") [");
        poVar8 = std::operator<<(poVar8,"lid >= 0 && rid >= 0 && matrix.is_valid(lid, rid)");
        poVar8 = std::operator<<(poVar8,"] ");
        poVar8 = std::operator<<(poVar8,"invalid ids are found lid=");
        poVar8 = (ostream *)std::ostream::operator<<(poVar8,local_f90);
        in_stack_ffffffffffffec10 = std::operator<<(poVar8," rid=");
        poVar8 = (ostream *)std::ostream::operator<<(in_stack_ffffffffffffec10,local_f94);
        die::operator&(&local_f95,poVar8);
      }
      if (bVar1) {
        die::~die((die *)0x1337f4);
      }
      escape_csv_element((string *)in_stack_ffffffffffffec10);
      in_stack_ffffffffffffec00 = std::operator<<((ostream *)local_c40,local_ef8);
      in_stack_ffffffffffffebf8 = std::operator<<(in_stack_ffffffffffffec00,',');
      in_stack_ffffffffffffebf0 =
           (ostream *)std::ostream::operator<<(in_stack_ffffffffffffebf8,local_f90);
      poVar8 = std::operator<<(in_stack_ffffffffffffebf0,',');
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,local_f94);
      poVar8 = std::operator<<(poVar8,',');
      in_stack_ffffffffffffebd0 = (DecoderFeatureIndex *)std::ostream::operator<<(poVar8,local_f28);
      poVar8 = std::operator<<((ostream *)in_stack_ffffffffffffebd0,',');
      in_stack_ffffffffffffebc0 = (DecoderFeatureIndex *)std::operator<<(poVar8,local_f20);
      std::operator<<((ostream *)in_stack_ffffffffffffebc0,'\n');
      std::__cxx11::string::~string(local_f88);
      std::__cxx11::string::~string(local_f68);
      std::__cxx11::string::~string(local_f48);
      std::__cxx11::string::~string(local_f20);
      std::__cxx11::string::~string(local_ef8);
    }
    scoped_fixed_array<char,_8192>::~scoped_fixed_array
              ((scoped_fixed_array<char,_8192> *)in_stack_ffffffffffffebc0);
    std::ifstream::~ifstream(local_e58);
  }
  std::ofstream::~ofstream(local_c40);
  Iconv::~Iconv(&local_a38);
  std::__cxx11::string::~string(local_a20);
  std::__cxx11::string::~string(local_9f8);
  std::__cxx11::string::~string(local_9b0);
  std::__cxx11::string::~string(local_968);
  std::__cxx11::string::~string(local_920);
  std::__cxx11::string::~string(local_8d8);
  std::__cxx11::string::~string(local_890);
  std::__cxx11::string::~string(local_870);
  CharProperty::~CharProperty((CharProperty *)in_stack_ffffffffffffebd0);
  ContextID::~ContextID((ContextID *)in_stack_ffffffffffffebc0);
  DecoderFeatureIndex::~DecoderFeatureIndex(in_stack_ffffffffffffebc0);
  DictionaryRewriter::~DictionaryRewriter((DictionaryRewriter *)in_stack_ffffffffffffebc0);
  Connector::~Connector((Connector *)in_stack_ffffffffffffebd0);
  return true;
}

Assistant:

bool Dictionary::assignUserDictionaryCosts(
    const Param &param,
    const std::vector<std::string> &dics,
    const char *output) {
  Connector matrix;
  DictionaryRewriter rewriter;
  DecoderFeatureIndex fi;
  ContextID cid;
  CharProperty property;

  const std::string dicdir = param.get<std::string>("dicdir");

  const std::string matrix_file     = DCONF(MATRIX_DEF_FILE);
  const std::string matrix_bin_file = DCONF(MATRIX_FILE);
  const std::string left_id_file    = DCONF(LEFT_ID_FILE);
  const std::string right_id_file   = DCONF(RIGHT_ID_FILE);
  const std::string rewrite_file    = DCONF(REWRITE_FILE);

  const std::string from = param.get<std::string>("dictionary-charset");

  const int factor = param.get<int>("cost-factor");
  CHECK_DIE(factor > 0)   << "cost factor needs to be positive value";

  std::string config_charset = param.get<std::string>("config-charset");
  if (config_charset.empty()) {
    config_charset = from;
  }

  CHECK_DIE(!from.empty()) << "input dictionary charset is empty";

  Iconv config_iconv;
  CHECK_DIE(config_iconv.open(config_charset.c_str(), from.c_str()))
      << "iconv_open() failed with from=" << config_charset << " to=" << from;

  rewriter.open(rewrite_file.c_str(), &config_iconv);
  CHECK_DIE(fi.open(param)) << "cannot open feature index";

  CHECK_DIE(property.open(param));
  property.set_charset(from.c_str());

  if (!matrix.openText(matrix_file.c_str()) &&
      !matrix.open(matrix_bin_file.c_str())) {
    matrix.set_left_size(1);
    matrix.set_right_size(1);
  }

  cid.open(left_id_file.c_str(),
           right_id_file.c_str(), &config_iconv);
  CHECK_DIE(cid.left_size()  == matrix.left_size() &&
            cid.right_size() == matrix.right_size())
      << "Context ID files("
      << left_id_file
      << " or "
      << right_id_file << " may be broken: "
      << cid.left_size() << " " << matrix.left_size() << " "
      << cid.right_size() << " " << matrix.right_size();

  std::ofstream ofs(output);
  CHECK_DIE(ofs) << "permission denied: " << output;

  for (size_t i = 0; i < dics.size(); ++i) {
    std::ifstream ifs(WPATH(dics[i].c_str()));
    CHECK_DIE(ifs) << "no such file or directory: " << dics[i];
    std::cout << "reading " << dics[i] << " ... ";
    scoped_fixed_array<char, BUF_SIZE> line;
    while (ifs.getline(line.get(), line.size())) {
#if 1 /* for Open JTalk */
      {
	/* if there is CR code, it should be removed */
	char *tmpstr = line.get();
	if(tmpstr != NULL){
	  size_t tmplen = strlen(tmpstr);
	  if(tmplen > 0){
	    if(tmpstr[tmplen-1] == '\r'){
	      tmpstr[tmplen-1] = '\0';
	    }
	  }
	}
      }
#endif
      char *col[8];
      const size_t n = tokenizeCSV(line.get(), col, 5);
      CHECK_DIE(n == 5) << "format error: " << line.get();
      std::string w = col[0];
      const std::string feature = col[4];
      const int cost = calcCost(w, feature, factor,
                                &fi, &rewriter, &property);
      std::string ufeature, lfeature, rfeature;
      CHECK_DIE(rewriter.rewrite(feature, &ufeature, &lfeature, &rfeature))
          << "rewrite failed: " << feature;
      const int lid = cid.lid(lfeature.c_str());
      const int rid = cid.rid(rfeature.c_str());
      CHECK_DIE(lid >= 0 && rid >= 0 && matrix.is_valid(lid, rid))
          << "invalid ids are found lid=" << lid << " rid=" << rid;
      escape_csv_element(&w);
      ofs << w << ',' << lid << ',' << rid << ','
          << cost << ',' << feature << '\n';
    }
  }

  return true;
}